

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O2

void Js::JavascriptExceptionOperators::DumpStackTrace
               (JavascriptExceptionContext *exceptionContext,bool isThrownException)

{
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this;
  bool bVar1;
  ulong in_RAX;
  Type *this_00;
  FunctionBody *pFVar2;
  LPCWSTR pWVar3;
  int i;
  uint index;
  undefined8 local_38;
  ULONG lineNumber;
  LONG characterPosition;
  
  if (((exceptionContext->m_stackTrace).ptr !=
       (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (local_38 = in_RAX, bVar1 = Phases::IsEnabled((Phases *)&DAT_01433318,ExceptionStackTracePhase)
     , bVar1 && isThrownException)) {
    Output::Print(L"\nStack trace for thrown exception\n");
    this = (exceptionContext->m_stackTrace).ptr;
    for (index = 0;
        (int)index <
        (this->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        ).count; index = index + 1) {
      this_00 = JsUtil::
                List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this,index);
      local_38 = 0;
      bVar1 = JavascriptExceptionContext::StackFrame::IsScriptFunction(this_00);
      if ((bVar1) &&
         (pFVar2 = JavascriptExceptionContext::StackFrame::GetFunctionBody(this_00),
         (((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
          field_0xa8 & 4) == 0)) {
        pFVar2 = JavascriptExceptionContext::StackFrame::GetFunctionBody(this_00);
        FunctionBody::GetLineCharOffset
                  (pFVar2,(this_00->field_1).byteCodeOffset,(ULONG *)&local_38,
                   (LONG *)((long)&local_38 + 4),true);
      }
      pWVar3 = JavascriptExceptionContext::StackFrame::GetFunctionName(this_00);
      Output::Print(L"    %3d: %s (%d, %d)\n",(ulong)index,pWVar3,local_38 & 0xffffffff,
                    local_38 >> 0x20);
    }
    Output::Flush();
  }
  return;
}

Assistant:

void JavascriptExceptionOperators::DumpStackTrace(JavascriptExceptionContext& exceptionContext, bool isThrownException)
    {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (! exceptionContext.GetStackTrace()
            || ! Configuration::Global.flags.Dump.IsEnabled(ExceptionStackTracePhase)
            || ! isThrownException)
        {
            return;
        }
        Output::Print(_u("\nStack trace for thrown exception\n"));

        JavascriptExceptionContext::StackTrace *stackTrace = exceptionContext.GetStackTrace();
        for (int i=0; i < stackTrace->Count(); i++)
        {
            Js::JavascriptExceptionContext::StackFrame& currFrame = stackTrace->Item(i);
            ULONG lineNumber = 0;
            LONG characterPosition = 0;
            if (currFrame.IsScriptFunction() && !currFrame.GetFunctionBody()->GetUtf8SourceInfo()->GetIsLibraryCode())
            {
                currFrame.GetFunctionBody()->GetLineCharOffset(currFrame.GetByteCodeOffset(), &lineNumber, &characterPosition);
            }
            Output::Print(_u("    %3d: %s (%d, %d)\n"), i, currFrame.GetFunctionName(), lineNumber, characterPosition);
        }
        Output::Flush();
#endif
    }